

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_callnoyield(lua_State *L,StkId func,int nResults)

{
  int nResults_local;
  StkId func_local;
  lua_State *L_local;
  
  ccall(L,func,nResults,0x10001);
  return;
}

Assistant:

void luaD_callnoyield (lua_State *L, StkId func, int nResults) {
  ccall(L, func, nResults, nyci);
}